

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::Image::uploadSurface
          (Image *this,ConstPixelBufferAccess *access,VkQueue queue,Allocator *allocator,
          VkImageLayout layout,VkOffset3D offset,VkImageAspectFlagBits aspect,uint mipLevel,
          uint arrayElement)

{
  if ((aspect == VK_IMAGE_ASPECT_STENCIL_BIT) || (aspect == VK_IMAGE_ASPECT_DEPTH_BIT)) {
    uploadUsingBuffer(this,queue,allocator,layout,offset,(access->m_size).m_data[0],
                      (access->m_size).m_data[1],(access->m_size).m_data[2],mipLevel,arrayElement,
                      aspect,access->m_data);
  }
  else if (aspect == VK_IMAGE_ASPECT_COLOR_BIT) {
    upload(this,queue,allocator,layout,offset,(access->m_size).m_data[0],(access->m_size).m_data[1],
           (access->m_size).m_data[2],mipLevel,arrayElement,VK_IMAGE_ASPECT_COLOR_BIT,
           VK_IMAGE_TYPE_2D,access->m_data);
  }
  return;
}

Assistant:

void Image::uploadSurface (const tcu::ConstPixelBufferAccess&	access,
						   vk::VkQueue							queue,
						   vk::Allocator&						allocator,
						   vk::VkImageLayout					layout,
						   vk::VkOffset3D						offset,
						   vk::VkImageAspectFlagBits			aspect,
						   unsigned int							mipLevel,
						   unsigned int							arrayElement)
{
	if (aspect == vk::VK_IMAGE_ASPECT_COLOR_BIT)
	{
		upload(queue, allocator, layout, offset, access.getWidth(),
			access.getHeight(), access.getDepth(), mipLevel, arrayElement, aspect, vk::VK_IMAGE_TYPE_2D,
			access.getDataPtr());
	}
	if (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT || aspect == vk::VK_IMAGE_ASPECT_STENCIL_BIT)
	{
		uploadUsingBuffer(queue, allocator, layout, offset, access.getWidth(),
			access.getHeight(), access.getDepth(), mipLevel, arrayElement, aspect, access.getDataPtr());
	}
}